

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O3

void __thiscall
fmt::internal::PrintfArgFormatter<wchar_t>::visit_char(PrintfArgFormatter<wchar_t> *this,int value)

{
  BasicWriter<wchar_t> *this_00;
  FormatSpec *pFVar1;
  undefined8 *puVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  uint uVar7;
  undefined8 *puVar8;
  long lVar9;
  ulong uVar10;
  int *piVar11;
  ulong uVar12;
  int iVar14;
  undefined1 auVar13 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  int iVar18;
  undefined1 auVar17 [16];
  
  this_00 = (this->super_ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t>).
            writer_;
  pFVar1 = (this->super_ArgFormatterBase<fmt::internal::PrintfArgFormatter<wchar_t>,_wchar_t>).spec_
  ;
  if ((pFVar1->type_ != '\0') && (pFVar1->type_ != 'c')) {
    BasicWriter<wchar_t>::write_int<int,fmt::FormatSpec>(this_00,value,*pFVar1);
  }
  uVar12 = (ulong)(pFVar1->super_AlignSpec).super_WidthSpec.width_;
  if (uVar12 < 2) {
    puVar2 = *(undefined8 **)(this_00 + 8);
    lVar9 = puVar2[2];
    uVar12 = lVar9 + 1;
    puVar8 = puVar2;
    if ((ulong)puVar2[3] < uVar12) {
      (**(code **)*puVar2)(puVar2,uVar12);
      puVar8 = *(undefined8 **)(this_00 + 8);
    }
    puVar2[2] = uVar12;
    piVar11 = (int *)(lVar9 * 4 + puVar8[1]);
  }
  else {
    puVar2 = *(undefined8 **)(this_00 + 8);
    lVar9 = puVar2[2];
    uVar12 = uVar12 + lVar9;
    puVar8 = puVar2;
    if ((ulong)puVar2[3] < uVar12) {
      (**(code **)*puVar2)(puVar2,uVar12);
      puVar8 = *(undefined8 **)(this_00 + 8);
    }
    puVar2[2] = uVar12;
    auVar6 = _DAT_001478a0;
    auVar5 = _DAT_00143c30;
    auVar4 = _DAT_00143c20;
    lVar3 = puVar8[1];
    piVar11 = (int *)(lVar3 + lVar9 * 4);
    uVar7 = (pFVar1->super_AlignSpec).super_WidthSpec.width_ - 1;
    if ((pFVar1->super_AlignSpec).align_ == ALIGN_LEFT) {
      if (uVar7 != 0) {
        uVar12 = (ulong)uVar7 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar13._8_4_ = (int)uVar12;
        auVar13._0_8_ = uVar12;
        auVar13._12_4_ = (int)(uVar12 >> 0x20);
        lVar3 = lVar3 + lVar9 * 4;
        lVar9 = 0;
        auVar13 = auVar13 ^ _DAT_00143c30;
        do {
          auVar15._8_4_ = (int)lVar9;
          auVar15._0_8_ = lVar9;
          auVar15._12_4_ = (int)((ulong)lVar9 >> 0x20);
          auVar17 = (auVar15 | auVar4) ^ auVar5;
          iVar14 = auVar13._4_4_;
          if ((bool)(~(auVar17._4_4_ == iVar14 && auVar13._0_4_ < auVar17._0_4_ ||
                      iVar14 < auVar17._4_4_) & 1)) {
            *(undefined4 *)(lVar3 + 4 + lVar9 * 4) = 0x20;
          }
          if ((auVar17._12_4_ != auVar13._12_4_ || auVar17._8_4_ <= auVar13._8_4_) &&
              auVar17._12_4_ <= auVar13._12_4_) {
            *(undefined4 *)(lVar3 + 8 + lVar9 * 4) = 0x20;
          }
          auVar17 = (auVar15 | auVar6) ^ auVar5;
          iVar18 = auVar17._4_4_;
          if (iVar18 <= iVar14 && (iVar18 != iVar14 || auVar17._0_4_ <= auVar13._0_4_)) {
            *(undefined4 *)(lVar3 + 0xc + lVar9 * 4) = 0x20;
            *(undefined4 *)(lVar3 + 0x10 + lVar9 * 4) = 0x20;
          }
          lVar9 = lVar9 + 4;
        } while ((uVar12 - ((uint)((ulong)uVar7 + 0x3fffffffffffffff) & 3)) + 4 != lVar9);
      }
    }
    else {
      if (uVar7 == 0) {
        uVar12 = 0;
      }
      else {
        uVar12 = (ulong)uVar7;
        uVar10 = uVar12 + 0x3fffffffffffffff & 0x3fffffffffffffff;
        auVar17._8_4_ = (int)uVar10;
        auVar17._0_8_ = uVar10;
        auVar17._12_4_ = (int)(uVar10 >> 0x20);
        lVar3 = lVar3 + lVar9 * 4;
        lVar9 = 0;
        auVar17 = auVar17 ^ _DAT_00143c30;
        do {
          auVar16._8_4_ = (int)lVar9;
          auVar16._0_8_ = lVar9;
          auVar16._12_4_ = (int)((ulong)lVar9 >> 0x20);
          auVar13 = (auVar16 | auVar4) ^ auVar5;
          iVar14 = auVar17._4_4_;
          if ((bool)(~(auVar13._4_4_ == iVar14 && auVar17._0_4_ < auVar13._0_4_ ||
                      iVar14 < auVar13._4_4_) & 1)) {
            *(undefined4 *)(lVar3 + lVar9 * 4) = 0x20;
          }
          if ((auVar13._12_4_ != auVar17._12_4_ || auVar13._8_4_ <= auVar17._8_4_) &&
              auVar13._12_4_ <= auVar17._12_4_) {
            *(undefined4 *)(lVar3 + 4 + lVar9 * 4) = 0x20;
          }
          auVar16 = (auVar16 | auVar6) ^ auVar5;
          iVar18 = auVar16._4_4_;
          if (iVar18 <= iVar14 && (iVar18 != iVar14 || auVar16._0_4_ <= auVar17._0_4_)) {
            *(undefined4 *)(lVar3 + 8 + lVar9 * 4) = 0x20;
            *(undefined4 *)(lVar3 + 0xc + lVar9 * 4) = 0x20;
          }
          lVar9 = lVar9 + 4;
        } while ((uVar10 - ((uint)(uVar12 + 0x3fffffffffffffff) & 3)) + 4 != lVar9);
      }
      piVar11 = piVar11 + uVar12;
    }
  }
  *piVar11 = value;
  return;
}

Assistant:

void visit_char(int value) {
    const FormatSpec &fmt_spec = this->spec();
    BasicWriter<Char> &w = this->writer();
    if (fmt_spec.type_ && fmt_spec.type_ != 'c')
      w.write_int(value, fmt_spec);
    typedef typename BasicWriter<Char>::CharPtr CharPtr;
    CharPtr out = CharPtr();
    if (fmt_spec.width_ > 1) {
      Char fill = ' ';
      out = w.grow_buffer(fmt_spec.width_);
      if (fmt_spec.align_ != ALIGN_LEFT) {
        std::fill_n(out, fmt_spec.width_ - 1, fill);
        out += fmt_spec.width_ - 1;
      } else {
        std::fill_n(out + 1, fmt_spec.width_ - 1, fill);
      }
    } else {
      out = w.grow_buffer(1);
    }
    *out = static_cast<Char>(value);
  }